

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *tag,word *ptr)

{
  ushort uVar1;
  unsigned_long uVar2;
  int iVar3;
  uint uVar4;
  WirePointer *typedPtr;
  Iterator __begin6;
  ulong uVar5;
  WirePointer *pWVar6;
  uint uVar7;
  bool bVar8;
  Fault f;
  Iterator __end7;
  Fault local_50;
  uint local_44;
  ulong local_40;
  word *local_38;
  
  if (segment->readOnly != false) {
    return;
  }
  switch((tag->offsetAndKind).value & 3) {
  case 0:
    pWVar6 = (WirePointer *)(ptr + (tag->field_1).structRef.dataSize.value);
    uVar5 = (ulong)(tag->field_1).structRef.ptrCount.value;
    while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
      zeroObject(segment,capTable,pWVar6);
      pWVar6 = pWVar6 + 1;
    }
    iVar3 = (uint)(tag->field_1).structRef.ptrCount.value +
            (uint)(tag->field_1).structRef.dataSize.value;
    if (iVar3 == 0) {
      return;
    }
    uVar4 = iVar3 * 8;
    break;
  case 1:
    uVar4 = (tag->field_1).upper32Bits;
    switch(uVar4 & 7) {
    case 0:
      return;
    default:
      uVar5 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)((byte)uVar4 & 7) * 4) *
              (ulong)(uVar4 >> 3) + 0x3f;
      if ((int)(uVar5 >> 6) == 0) {
        return;
      }
      uVar4 = (uint)(uVar5 >> 3) & 0xfffffff8;
      break;
    case 6:
      for (uVar5 = 0; (uVar4 & 0xfffffff8) != uVar5; uVar5 = uVar5 + 8) {
        zeroObject(segment,capTable,(WirePointer *)((long)&ptr->content + uVar5));
      }
      if (uVar4 < 8) {
        return;
      }
      uVar4 = uVar4 & 0xfffffff8;
      break;
    case 7:
      uVar4 = (uint)ptr->content;
      if ((uVar4 & 3) != 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                  (&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x2b7,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                   "\"Don\'t know how to handle non-STRUCT inline composite.\"",
                   (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
        kj::_::Debug::Fault::fatal(&local_50);
      }
      uVar4 = uVar4 >> 2 & 0x1fffffff;
      uVar5 = 0;
      uVar1 = *(ushort *)((long)&ptr->content + 4);
      local_44 = (uint)*(ushort *)((long)&ptr->content + 6);
      if (local_44 != 0) {
        local_40 = (ulong)uVar1;
        pWVar6 = (WirePointer *)(ptr + 1);
        local_38 = ptr;
        for (; (uint)uVar5 != uVar4; uVar5 = (ulong)((uint)uVar5 + 1)) {
          pWVar6 = pWVar6 + local_40;
          uVar7 = local_44;
          while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
            zeroObject(segment,capTable,pWVar6);
            pWVar6 = pWVar6 + 1;
          }
        }
        uVar1 = *(ushort *)((long)&local_38->content + 4);
        uVar5 = (ulong)*(ushort *)((long)&local_38->content + 6);
        ptr = local_38;
      }
      uVar2 = assertMaxBits<29u,unsigned_long,capnp::_::WireHelpers::zeroObject(capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::WirePointer*,capnp::word*)::_lambda()_1_>
                        ((uVar1 + uVar5) * (ulong)uVar4 + 1,(anon_class_1_0_00000001 *)&local_50);
      if ((int)uVar2 == 0) {
        return;
      }
      memset(ptr,0,(ulong)(uint)((int)uVar2 << 3));
      return;
    }
    break;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2d4,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
               (char (*) [24])"Unexpected FAR pointer.");
    goto LAB_002943bb;
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2d9,FAILED,(char *)0x0,"\"Unexpected OTHER pointer.\"",
               (char (*) [26])"Unexpected OTHER pointer.");
LAB_002943bb:
    kj::_::Debug::Fault::~Fault(&local_50);
    return;
  }
  memset(ptr,0,(ulong)uVar4);
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable,
                         WirePointer* tag, word* ptr) {
    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (tag->kind()) {
      case WirePointer::STRUCT: {
        WirePointer* pointerSection =
            reinterpret_cast<WirePointer*>(ptr + tag->structRef.dataSize.get());
        for (auto i: kj::zeroTo(tag->structRef.ptrCount.get())) {
          zeroObject(segment, capTable, pointerSection + i);
        }
        zeroMemory(ptr, tag->structRef.wordSize());
        break;
      }
      case WirePointer::LIST: {
        switch (tag->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            zeroMemory(ptr, roundBitsUpToWords(
                upgradeBound<uint64_t>(tag->listRef.elementCount()) *
                dataBitsPerElement(tag->listRef.elementSize())));
            break;
          }
          case ElementSize::POINTER: {
            WirePointer* typedPtr = reinterpret_cast<WirePointer*>(ptr);
            auto count = tag->listRef.elementCount() * (ONE * POINTERS / ELEMENTS);
            for (auto i: kj::zeroTo(count)) {
              zeroObject(segment, capTable, typedPtr + i);
            }
            zeroMemory(typedPtr, count);
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            WirePointer* elementTag = reinterpret_cast<WirePointer*>(ptr);

            KJ_ASSERT(elementTag->kind() == WirePointer::STRUCT,
                  "Don't know how to handle non-STRUCT inline composite.");
            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            auto count = elementTag->inlineCompositeListElementCount();
            if (pointerCount > ZERO * POINTERS) {
              word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  zeroObject(segment, capTable, reinterpret_cast<WirePointer*>(pos));
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }

            auto wordsPerElement = elementTag->structRef.wordSize() / ELEMENTS;
            zeroMemory(ptr, assertMaxBits<SEGMENT_WORD_COUNT_BITS>(POINTER_SIZE_IN_WORDS +
                upgradeBound<uint64_t>(count) * wordsPerElement, []() {
                  KJ_FAIL_ASSERT("encountered list pointer in builder which is too large to "
                      "possibly fit in a segment. Bug in builder code?");
                }));
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        KJ_FAIL_ASSERT("Unexpected OTHER pointer.") {
          break;
        }
        break;
    }
  }